

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O1

void __thiscall QFbVtHandler::QFbVtHandler(QFbVtHandler *this,QObject *parent)

{
  long lVar1;
  int iVar2;
  QSocketNotifier *this_00;
  undefined4 *puVar3;
  QFbVtHandler *this_01;
  long in_FS_OFFSET;
  code *local_e8;
  ImplFn local_e0;
  QObject local_d8 [8];
  sigaction sa;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,parent);
  *(undefined ***)this = &PTR_metaObject_00126530;
  *(undefined4 *)(this + 0x10) = 0xffffffff;
  *(undefined8 *)(this + 0x20) = 0;
  iVar2 = isatty(0);
  if (iVar2 != 0) {
    *(undefined4 *)(this + 0x10) = 0;
  }
  this_01 = (QFbVtHandler *)0x1;
  iVar2 = socketpair(1,1,0,(int *)(this + 0x18));
  if (iVar2 == 0) {
    vth = (QFbVtHandler *)this;
    setTTYCursor(false);
    setKeyboardEnabled(this,false);
    this_00 = (QSocketNotifier *)operator_new(0x10);
    QSocketNotifier::QSocketNotifier(this_00,(long)*(int *)(this + 0x1c),Read,(QObject *)this);
    *(QSocketNotifier **)(this + 0x20) = this_00;
    local_e8 = handleSignal;
    local_e0 = (ImplFn)0x0;
    sa.__sigaction_handler.sa_handler = QSocketNotifier::activated;
    sa.sa_mask.__val[0] = 0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::QCallableObject<void_(QFbVtHandler::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar3 + 4) = handleSignal;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              (local_d8,(void **)this_00,(QObject *)&sa,(void **)this,(QSlotObjectBase *)&local_e8,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_d8);
    iVar2 = qEnvironmentVariableIntValue("QT_QPA_NO_SIGNAL_HANDLER",(bool *)0x0);
    if (iVar2 == 0) {
      memset((sigaction *)&sa,0xaa,0x98);
      sa.sa_flags = 0;
      sa.__sigaction_handler.sa_handler = signalHandler;
      sigemptyset((sigset_t *)&sa.sa_mask);
      sigaction(2,(sigaction *)&sa,(sigaction *)0x0);
      sigaction(0x14,(sigaction *)&sa,(sigaction *)0x0);
      sigaction(0x12,(sigaction *)&sa,(sigaction *)0x0);
      sigaction(0xf,(sigaction *)&sa,(sigaction *)0x0);
    }
  }
  else {
    QFbVtHandler(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFbVtHandler::QFbVtHandler(QObject *parent)
    : QObject(parent),
      m_tty(-1),
      m_signalNotifier(0)
{
#ifdef VTH_ENABLED
    if (isatty(0))
        m_tty = 0;

    if (::socketpair(AF_UNIX, SOCK_STREAM, 0, m_sigFd)) {
        qErrnoWarning(errno, "QFbVtHandler: socketpair() failed");
        return;
    }

    vth = this;
    setTTYCursor(false);
    setKeyboardEnabled(false);

    m_signalNotifier = new QSocketNotifier(m_sigFd[1], QSocketNotifier::Read, this);
    connect(m_signalNotifier, &QSocketNotifier::activated, this, &QFbVtHandler::handleSignal);

    if (!qEnvironmentVariableIntValue("QT_QPA_NO_SIGNAL_HANDLER")) {
        struct sigaction sa;
        sa.sa_flags = 0;
        sa.sa_handler = signalHandler;
        sigemptyset(&sa.sa_mask);
        sigaction(SIGINT, &sa, 0); // Ctrl+C
        sigaction(SIGTSTP, &sa, 0); // Ctrl+Z
        sigaction(SIGCONT, &sa, 0);
        sigaction(SIGTERM, &sa, 0); // default signal used by kill
    }
#endif
}